

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

void __thiscall hgdb::json::Module::~Module(Module *this)

{
  Module *this_local;
  
  ~Module(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

Module(std::string name, std::function<void(const std::string &)> remove_func)
        : name_(std::move(name)), remove_inst_(std::move(remove_func)) {}